

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O1

void * lzham::lzham_realloc
                 (lzham_malloc_context context,void *p,size_t size,size_t *pActual_size,bool movable
                 )

{
  uint uVar1;
  uint uVar2;
  void *__dest;
  uint uVar3;
  uint uVar4;
  char *pExp;
  int iVar5;
  size_t actual_size;
  size_t local_38;
  
  if (context == (lzham_malloc_context)0x0) {
    lzham_assert("context",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x13c);
  }
  if (((ulong)p & 0xf) != 0) {
    pExp = "lzham_realloc: bad ptr";
LAB_0011338b:
    lzham_assert(pExp,
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x98);
    return (void *)0x0;
  }
  if (0x400000000 < size) {
    pExp = "lzham_malloc: size too big";
    goto LAB_0011338b;
  }
  local_38 = size;
  if (*context != 0x5749abcd) {
    lzham_assert("pContext->m_sig == malloc_context::cSig",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x153);
  }
  uVar1 = *(uint *)((long)context + 4);
  iVar5 = (int)size;
  if (p < (void *)((long)context + (ulong)uVar1 + 0x34) && (void *)((long)context + 0x34U) <= p) {
    if (!movable) {
      return (void *)0x0;
    }
    uVar2 = *(uint *)((long)p + -4);
    __dest = p;
    if (size <= uVar2) goto LAB_001134f1;
    if (size < 0x8000 && uVar1 != 0) {
      uVar4 = *(uint *)((long)context + 0x30);
      uVar3 = iVar5 + 0x1fU & 0xfff0;
      if (uVar1 - uVar4 < uVar3) goto LAB_00113437;
      __dest = (void *)((long)context + (ulong)uVar4 + 0x44);
      *(int *)((long)context + (ulong)uVar4 + 0x40) = iVar5;
      *(uint *)((long)context + 0x30) = uVar3 + uVar4;
    }
    else {
LAB_00113437:
      __dest = (void *)0x0;
    }
    if (__dest == (void *)0x0) {
      __dest = (void *)(*(code *)g_pRealloc)(0,size,&local_38,1,g_pUser_data);
    }
    memcpy(__dest,p,(ulong)uVar2);
    goto LAB_001134f1;
  }
  if ((p == (void *)0x0) && (size < 0x8000 && uVar1 != 0)) {
    uVar2 = *(uint *)((long)context + 0x30);
    uVar4 = iVar5 + 0x1fU & 0xfff0;
    if (uVar1 - uVar2 < uVar4) goto LAB_0011346d;
    __dest = (void *)((long)context + (ulong)uVar2 + 0x44);
    *(int *)((long)context + (ulong)uVar2 + 0x40) = iVar5;
    *(uint *)((long)context + 0x30) = uVar4 + uVar2;
  }
  else {
LAB_0011346d:
    __dest = (void *)0x0;
  }
  if (__dest == (void *)0x0) {
    __dest = (void *)(*(code *)g_pRealloc)(p,size,&local_38,movable,g_pUser_data);
  }
LAB_001134f1:
  if (pActual_size != (size_t *)0x0) {
    *pActual_size = local_38;
    return __dest;
  }
  return __dest;
}

Assistant:

void* lzham_realloc(lzham_malloc_context context, void* p, size_t size, size_t* pActual_size, bool movable)
   {
      LZHAM_VERIFY(context);

      if ((ptr_bits_t)p & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_realloc: bad ptr");
         return NULL;
      }

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

#if LZHAM_MEM_STATS
      size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
#endif

      size_t actual_size = size;
      void *p_new;
      
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      if (pContext->ptr_is_in_arena(p))
      {
         if (!movable)
            return NULL;
         
         uint prev_size = pContext->arena_msize(p);
         if (size <= prev_size)
         {
            p_new = p;
         }
         else
         {
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
            if (!p_new)
            {
               p_new = (*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data);
            }
          
            memcpy(p_new, p, prev_size);
         }
      }
      else
      {
         p_new = NULL;

         if (!p)
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
         
         if (!p_new)
            p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);
      }

      if (pActual_size)
         *pActual_size = actual_size;

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      int num_new_blocks = 0;
      if (p)
      {
         if (!p_new)
            num_new_blocks = -1;
      }
      else if (p_new)
      {
         num_new_blocks = 1;
      }
      pContext->update_total_allocated(num_new_blocks, static_cast<int64>(actual_size) - static_cast<int64>(cur_size));
#endif

      return p_new;
   }